

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix maths::Matrix::solve(Matrix *A,Matrix *b)

{
  double *pdVar1;
  domain_error *this;
  long in_RDX;
  double **ppdVar2;
  Matrix *in_RSI;
  int *in_RDI;
  Matrix MVar3;
  int j_1;
  int sum;
  int i_1;
  int k;
  int j;
  int i;
  Matrix *x;
  int local_44;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (in_RSI->rows_ <= local_1c) {
      Matrix(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      ppdVar2 = (double **)(long)(*in_RDI + -1);
      **(double **)(*(long *)(in_RDI + 2) + (long)ppdVar2 * 8) =
           **(double **)(*(long *)(in_RDX + 8) + (long)(*in_RDI + -1) * 8) /
           in_RSI->p[*in_RDI + -1][*in_RDI + -1];
      pdVar1 = *(double **)(*(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 8);
      if ((*pdVar1 <= 1e-10 && *pdVar1 != 1e-10) &&
         (-1e-10 < **(double **)(*(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 8))) {
        **(undefined8 **)(*(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 8) = 0;
      }
      for (local_3c = *in_RDI + -2; -1 < local_3c; local_3c = local_3c + -1) {
        local_40 = 0;
        local_44 = local_3c;
        while (local_44 = local_44 + 1, local_44 < *in_RDI) {
          local_40 = (int)(in_RSI->p[local_3c][local_44] *
                           **(double **)(*(long *)(in_RDI + 2) + (long)local_44 * 8) +
                          (double)local_40);
        }
        ppdVar2 = (double **)(long)local_3c;
        **(double **)(*(long *)(in_RDI + 2) + (long)ppdVar2 * 8) =
             (**(double **)(*(long *)(in_RDX + 8) + (long)local_3c * 8) - (double)local_40) /
             in_RSI->p[local_3c][local_3c];
        pdVar1 = *(double **)(*(long *)(in_RDI + 2) + (long)local_3c * 8);
        if ((*pdVar1 <= 1e-10 && *pdVar1 != 1e-10) &&
           (-1e-10 < **(double **)(*(long *)(in_RDI + 2) + (long)local_3c * 8))) {
          **(undefined8 **)(*(long *)(in_RDI + 2) + (long)local_3c * 8) = 0;
        }
      }
      MVar3.p = ppdVar2;
      MVar3._0_8_ = in_RDI;
      return MVar3;
    }
    local_30 = local_1c;
    if ((in_RSI->p[local_1c][local_1c] == 0.0) && (!NAN(in_RSI->p[local_1c][local_1c]))) break;
    while (local_30 = local_30 + 1, local_34 = local_1c, local_30 < in_RSI->rows_) {
      while (local_34 = local_34 + 1, local_34 < in_RSI->cols_) {
        in_RSI->p[local_30][local_34] =
             -in_RSI->p[local_1c][local_34] *
             (in_RSI->p[local_30][local_1c] / in_RSI->p[local_1c][local_1c]) +
             in_RSI->p[local_30][local_34];
        if ((in_RSI->p[local_30][local_34] <= 1e-10 && in_RSI->p[local_30][local_34] != 1e-10) &&
           (-1e-10 < in_RSI->p[local_30][local_34])) {
          in_RSI->p[local_30][local_34] = 0.0;
        }
      }
      pdVar1 = *(double **)(*(long *)(in_RDX + 8) + (long)local_30 * 8);
      *pdVar1 = -**(double **)(*(long *)(in_RDX + 8) + (long)local_1c * 8) *
                (in_RSI->p[local_30][local_1c] / in_RSI->p[local_1c][local_1c]) + *pdVar1;
      if ((*in_RSI->p[local_30] <= 1e-10 && *in_RSI->p[local_30] != 1e-10) &&
         (-1e-10 < *in_RSI->p[local_30])) {
        *in_RSI->p[local_30] = 0.0;
      }
      in_RSI->p[local_30][local_1c] = 0.0;
    }
    local_1c = local_1c + 1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error
            (this,
             "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

Matrix Matrix::solve(Matrix A, Matrix b)
{
    // Gaussian elimination
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw error
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_; ++j) {
            for (int k = i + 1; k < A.cols_; ++k) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                if (A.p[j][k] < EPS && A.p[j][k] > -1*EPS)
                    A.p[j][k] = 0;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            if (A.p[j][0] < EPS && A.p[j][0] > -1*EPS)
                A.p[j][0] = 0;
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    if (x.p[x.rows_ - 1][0] < EPS && x.p[x.rows_ - 1][0] > -1*EPS)
        x.p[x.rows_ - 1][0] = 0;
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
        if (x.p[i][0] < EPS && x.p[i][0] > -1*EPS)
            x.p[i][0] = 0;
    }

    return x;
}